

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O0

_vector3<float> * __thiscall
xray_re::_vector3<float>::cross_product(_vector3<float> *this,_vector3<float> *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float _y;
  float _x;
  _vector3<float> *v_local;
  _vector3<float> *this_local;
  
  fVar1 = (v->field_0).field_0.z;
  fVar2 = (this->field_0).field_0.z;
  fVar3 = (v->field_0).field_0.y;
  fVar4 = (this->field_0).field_0.z;
  fVar5 = (v->field_0).field_0.x;
  fVar6 = (this->field_0).field_0.x;
  fVar7 = (v->field_0).field_0.z;
  (this->field_0).field_0.z =
       (this->field_0).field_0.x * (v->field_0).field_0.y +
       -((this->field_0).field_0.y * (v->field_0).field_0.x);
  (this->field_0).field_0.x = (this->field_0).field_0.y * fVar1 + -(fVar2 * fVar3);
  (this->field_0).field_0.y = fVar4 * fVar5 + -(fVar6 * fVar7);
  return this;
}

Assistant:

inline _vector3<T>& _vector3<T>::cross_product(const _vector3<T>& v)
{
	T _x = y*v.z - z*v.y;
	T _y = z*v.x - x*v.z;
	z = x*v.y - y*v.x;
	x = _x;
	y = _y;
	return *this;
}